

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opcodes.cpp
# Opt level: O0

void Opcodes::AAA(SFLAG_Register *sfr,GEN_Register *gr,RAM *mem,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *cmd)

{
  RAM *this;
  RAM *this_00;
  GEN_Register *pGVar1;
  byte bVar2;
  uint8_t uVar3;
  bool local_13a;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  byte local_83;
  byte local_82;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *cmd_local;
  RAM *mem_local;
  GEN_Register *gr_local;
  SFLAG_Register *sfr_local;
  
  local_28 = cmd;
  cmd_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)mem;
  mem_local = (RAM *)gr;
  gr_local = (GEN_Register *)sfr;
  std::allocator<char>::allocator();
  local_82 = 0;
  local_83 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"AL",&local_49);
  bVar2 = GEN_Register::getReg_8(gr,&local_48);
  pGVar1 = gr_local;
  local_13a = true;
  if ((bVar2 & 0xf) < 10) {
    std::allocator<char>::allocator();
    local_82 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"AF",&local_81);
    local_83 = 1;
    local_13a = SFLAG_Register::getFlag((SFLAG_Register *)pGVar1,&local_80);
  }
  if ((local_83 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_80);
  }
  if ((local_82 & 1) != 0) {
    std::allocator<char>::~allocator(&local_81);
  }
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  pGVar1 = gr_local;
  this = mem_local;
  if (local_13a == false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"SF",&local_f9);
    SFLAG_Register::setFlag((SFLAG_Register *)pGVar1,&local_f8,false);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
    pGVar1 = gr_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"AF",&local_121);
    SFLAG_Register::setFlag((SFLAG_Register *)pGVar1,&local_120,false);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator(&local_121);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"AL",&local_a9);
    this_00 = mem_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"AL",&local_d1);
    uVar3 = GEN_Register::getReg_8((GEN_Register *)this_00,&local_d0);
    GEN_Register::setReg_8((GEN_Register *)this,&local_a8,uVar3 + 6 & 0xf);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
  }
  return;
}

Assistant:

void Opcodes::AAA(SFLAG_Register &sfr, GEN_Register &gr, RAM &mem, std::vector<std::string> &cmd) {
    if (((gr.getReg_8("AL") & 0x0F) > 9) || (sfr.getFlag("AF") == 1)) {
        gr.setReg_8("AL", (gr.getReg_8("AL") + 6) & 0x0F);
    } else {
        sfr.setFlag("SF", 0);
        sfr.setFlag("AF", 0);
    }
}